

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  int iVar1;
  xmlChar *arg2;
  xmlChar *pxVar2;
  xmlRelaxNGValidErr err;
  uint uVar3;
  xmlRelaxNGDefinePtr pxVar4;
  bool bVar5;
  
  if ((define->name != (xmlChar *)0x0) && (iVar1 = xmlStrEqual(elem->name,define->name), iVar1 == 0)
     ) {
    pxVar2 = define->name;
    arg2 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNAME;
    goto LAB_0018b1c4;
  }
  pxVar2 = define->ns;
  if ((pxVar2 == (xmlChar *)0x0) || (*pxVar2 == '\0')) {
    if ((elem->ns == (xmlNs *)0x0 || pxVar2 == (xmlChar *)0x0) || (define->name != (xmlChar *)0x0))
    {
      if ((elem->ns == (xmlNs *)0x0) || (pxVar2 = define->name, pxVar2 == (xmlChar *)0x0))
      goto LAB_0018b153;
    }
    else {
      pxVar2 = elem->name;
    }
    err = XML_RELAXNG_ERR_ELEMEXTRANS;
  }
  else {
    if (elem->ns != (xmlNs *)0x0) {
      iVar1 = xmlStrEqual(elem->ns->href,pxVar2);
      if (iVar1 == 0) {
        pxVar2 = elem->name;
        arg2 = define->ns;
        err = XML_RELAXNG_ERR_ELEMWRONGNS;
        goto LAB_0018b1c4;
      }
LAB_0018b153:
      pxVar4 = define->nameClass;
      if (pxVar4 == (xmlRelaxNGDefinePtr)0x0) {
        return 1;
      }
      if (pxVar4->type != XML_RELAXNG_CHOICE) {
        if (pxVar4->type != XML_RELAXNG_EXCEPT) {
          return -1;
        }
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = ctxt->flags;
          ctxt->flags = uVar3 | 1;
        }
        for (pxVar4 = pxVar4->content; bVar5 = pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0, !bVar5;
            pxVar4 = pxVar4->next) {
          iVar1 = xmlRelaxNGElementMatch(ctxt,pxVar4,elem);
          if (iVar1 == 1) {
            iVar1 = 1;
            elem = (xmlNodePtr)0x0;
            goto LAB_0018b292;
          }
          if (iVar1 < 0) goto LAB_0018b26c;
        }
        iVar1 = 1;
        goto LAB_0018b292;
      }
      if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = ctxt->flags;
        ctxt->flags = uVar3 | 1;
      }
      for (pxVar4 = pxVar4->nameClass; bVar5 = pxVar4 == (xmlRelaxNGDefinePtr_conflict)0x0, !bVar5;
          pxVar4 = pxVar4->next) {
        iVar1 = xmlRelaxNGElementMatch(ctxt,pxVar4,elem);
        if (iVar1 == 1) {
          elem = (xmlNodePtr)&DAT_00000001;
          iVar1 = 1;
          goto LAB_0018b292;
        }
        if (iVar1 < 0) goto LAB_0018b26c;
      }
      if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
        iVar1 = 0;
        goto LAB_0018b29f;
      }
      if (ctxt->errNr < 1) {
        iVar1 = 0;
      }
      else {
        iVar1 = 0;
        xmlRelaxNGPopErrors(ctxt,0);
      }
      goto LAB_0018b29b;
    }
    pxVar2 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNONS;
  }
  arg2 = (xmlChar *)0x0;
LAB_0018b1c4:
  xmlRelaxNGAddValidError(ctxt,err,pxVar2,arg2,0);
  return 0;
LAB_0018b26c:
  elem = (xmlNodePtr)0xffffffff;
  iVar1 = -1;
LAB_0018b292:
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) goto LAB_0018b29f;
LAB_0018b29b:
  ctxt->flags = uVar3;
LAB_0018b29f:
  if (bVar5) {
    return iVar1;
  }
  return (int)elem;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        /* TODO */
        ret = -1;
    }
    return (ret);
}